

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall
doctest::AssertData::AssertData
          (AssertData *this,Enum at,char *file,int line,char *expr,char *exception_type,
          StringContains *exception_string)

{
  this->m_test_case = *(TestCaseData **)(detail::g_cs + 0x20);
  this->m_at = at;
  this->m_file = file;
  this->m_line = line;
  this->m_expr = expr;
  this->m_failed = true;
  this->m_threw = false;
  (this->m_exception).field_0.buf[0] = '\0';
  *(undefined2 *)((long)&(this->m_exception).field_0 + 0x17) = 0x17;
  *(undefined2 *)((long)&(this->m_decomp).field_0 + 0x17) = 0x17;
  this->m_exception_type = exception_type;
  StringContains::StringContains(&this->m_exception_string,exception_string);
  return;
}

Assistant:

AssertData::AssertData(assertType::Enum at, const char* file, int line, const char* expr,
    const char* exception_type, const StringContains& exception_string)
    : m_test_case(g_cs->currentTest), m_at(at), m_file(file), m_line(line), m_expr(expr),
    m_failed(true), m_threw(false), m_threw_as(false), m_exception_type(exception_type),
    m_exception_string(exception_string) {
#if DOCTEST_MSVC
    if (m_expr[0] == ' ') // this happens when variadic macros are disabled under MSVC
        ++m_expr;
#endif // MSVC
}